

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

lua_Number lj_lib_checknum(lua_State *L,int narg)

{
  lua_Number lVar1;
  int iVar2;
  TValue *o;
  
  o = L->base + (long)narg + -1;
  if (L->top <= o) {
LAB_0015259a:
    lj_err_argt(L,narg,3);
  }
  lVar1 = o->n;
  if (0xfffffffffffffff2 < (ulong)((long)lVar1 >> 0x2f)) {
    if (((long)lVar1 >> 0x2f != 0xfffffffffffffffb) ||
       (iVar2 = lj_strscan_num((GCstr *)((ulong)lVar1 & 0x7fffffffffff),o), iVar2 == 0))
    goto LAB_0015259a;
    lVar1 = o->n;
  }
  return lVar1;
}

Assistant:

lua_Number lj_lib_checknum(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top &&
	(tvisnumber(o) || (tvisstr(o) && lj_strscan_num(strV(o), o)))))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_UNLIKELY(tvisint(o))) {
    lua_Number n = (lua_Number)intV(o);
    setnumV(o, n);
    return n;
  } else {
    return numV(o);
  }
}